

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void end_examples<dense_parameters>(lda *l,dense_parameters *weights)

{
  float *pfVar1;
  uint32_t uVar2;
  size_t i;
  weight *pwVar3;
  ulong uVar4;
  weight *pwVar5;
  float fVar6;
  
  uVar2 = weights->_stride_shift;
  pwVar3 = weights->_begin;
  for (pwVar5 = pwVar3; pwVar5 != pwVar3 + weights->_weight_mask + 1;
      pwVar5 = pwVar5 + (1L << ((byte)uVar2 & 0x3f))) {
    pfVar1 = (l->decay_levels)._end;
    fVar6 = expf(pfVar1[-1] - pfVar1[(int)((double)pwVar5[l->all->lda] + (-1.0 - l->example_t))]);
    if (1.0 <= fVar6) {
      fVar6 = 1.0;
    }
    for (uVar4 = 0; uVar4 < l->all->lda; uVar4 = uVar4 + 1) {
      pwVar5[uVar4] = pwVar5[uVar4] * fVar6;
    }
    pwVar3 = weights->_begin;
  }
  return;
}

Assistant:

void end_examples(lda &l, T &weights)
{
  for (typename T::iterator iter = weights.begin(); iter != weights.end(); ++iter)
  {
    float decay_component =
        l.decay_levels.last() - l.decay_levels.end()[(int)(-1 - l.example_t + (&(*iter))[l.all->lda])];
    float decay = fmin(1.f, correctedExp(decay_component));

    weight *wp = &(*iter);
    for (size_t i = 0; i < l.all->lda; ++i) wp[i] *= decay;
  }
}